

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

Gia_Man_t *
Gia_ManPerformDsdBalance(Gia_Man_t *p,int nLutSize,int nCutNum,int nRelaxRatio,int fVerbose)

{
  char *pcVar1;
  void *pvVar2;
  If_DsdMan_t *pIVar3;
  If_Man_t *p_00;
  Gia_Man_t *p_01;
  size_t sVar4;
  char *pcVar5;
  If_Par_t Pars;
  If_Par_t local_180;
  
  If_ManSetDefaultPars(&local_180);
  local_180.fDsdBalance = 1;
  local_180.fUseDsd = 1;
  local_180.fCutMin = 1;
  local_180.fTruth = 1;
  local_180.fExpRed = 0;
  local_180.nLutSize = nLutSize;
  local_180.nCutsMax = nCutNum;
  local_180.nRelaxRatio = nRelaxRatio;
  local_180.fVerbose = fVerbose;
  pvVar2 = Abc_FrameReadManDsd2();
  if (pvVar2 == (void *)0x0) {
    pIVar3 = If_DsdManAlloc(local_180.nLutSize,0);
    Abc_FrameSetManDsd2(pIVar3);
  }
  p_00 = Gia_ManToIf(p,&local_180);
  pIVar3 = (If_DsdMan_t *)Abc_FrameReadManDsd2();
  p_00->pIfDsdMan = pIVar3;
  if (local_180.fDsdBalance != 0) {
    If_DsdManAllocIsops(pIVar3,local_180.nLutSize);
  }
  If_ManPerformMapping(p_00);
  p_01 = Gia_ManFromIfAig(p_00);
  If_ManStop(p_00);
  Gia_ManTransferTiming(p_01,p);
  if (p_01->pName == (char *)0x0) {
    pcVar1 = p->pName;
    if (pcVar1 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar1);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,pcVar1);
    }
    p_01->pName = pcVar5;
    pcVar1 = p->pSpec;
    if (pcVar1 == (char *)0x0) {
      pcVar5 = (char *)0x0;
    }
    else {
      sVar4 = strlen(pcVar1);
      pcVar5 = (char *)malloc(sVar4 + 1);
      strcpy(pcVar5,pcVar1);
    }
    p_01->pSpec = pcVar5;
    Gia_ManSetRegNum(p_01,p->nRegs);
    return p_01;
  }
  __assert_fail("pNew->pName == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                ,0x9b0,"Gia_Man_t *Gia_ManPerformDsdBalance(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManPerformDsdBalance( Gia_Man_t * p, int nLutSize, int nCutNum, int nRelaxRatio, int fVerbose )
{
    Gia_Man_t * pNew;
    If_Man_t * pIfMan;
    If_Par_t Pars, * pPars = &Pars;
    If_ManSetDefaultPars( pPars );
    pPars->nCutsMax    = nCutNum;
    pPars->nRelaxRatio = nRelaxRatio;
    pPars->fVerbose    = fVerbose;
    pPars->nLutSize    = nLutSize;
    pPars->fDsdBalance = 1;
    pPars->fUseDsd     = 1;
    pPars->fCutMin     = 1;
    pPars->fTruth      = 1;
    pPars->fExpRed     = 0;
    if ( Abc_FrameReadManDsd2() == NULL )
        Abc_FrameSetManDsd2( If_DsdManAlloc(pPars->nLutSize, 0) );
    // perform mapping
    pIfMan = Gia_ManToIf( p, pPars );
    pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd2();
    if ( pPars->fDsdBalance )
        If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    If_ManPerformMapping( pIfMan );
    pNew = Gia_ManFromIfAig( pIfMan );
    If_ManStop( pIfMan );
    Gia_ManTransferTiming( pNew, p );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}